

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int event_callback_cancel(uint id)

{
  int pi;
  evtCallback_t *peVar1;
  evtCallback_t *peVar2;
  evtCallback_t **ppeVar3;
  evtCallback_t *__ptr;
  
  __ptr = geCallBackFirst;
  if (geCallBackFirst != (evtCallback_t *)0x0) {
    do {
      if (__ptr->id == id) {
        pi = __ptr->pi;
        peVar1 = __ptr->prev;
        ppeVar3 = &geCallBackFirst;
        if (peVar1 != (evtCallback_t *)0x0) {
          ppeVar3 = &peVar1->next;
        }
        peVar2 = __ptr->next;
        *ppeVar3 = peVar2;
        ppeVar3 = &geCallBackLast;
        if (peVar2 != (evtCallback_t *)0x0) {
          ppeVar3 = &peVar2->prev;
        }
        *ppeVar3 = peVar1;
        free(__ptr);
        findEventBits(pi);
        return 0;
      }
      ppeVar3 = &__ptr->next;
      __ptr = *ppeVar3;
    } while (*ppeVar3 != (evtCallback_t *)0x0);
  }
  return -0x7da;
}

Assistant:

int event_callback_cancel(unsigned id)
{
   evtCallback_t *ep;
   int pi;

   ep = geCallBackFirst;

   while (ep)
   {
      if (ep->id == id)
      {
         pi = ep->pi;

         if (ep->prev) {ep->prev->next = ep->next;}
         else          {geCallBackFirst = ep->next;}

         if (ep->next) {ep->next->prev = ep->prev;}
         else          {geCallBackLast = ep->prev;}

         free(ep);

         findEventBits(pi);

         return 0;
      }
      ep = ep->next;
   }
   return pigif_callback_not_found;
}